

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
slang::ast::FmtHelpers::formatDisplay_abi_cxx11_
          (Scope *scope,EvalContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args)

{
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  onArg;
  bool bVar1;
  reference ppEVar2;
  size_type sVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  EvalContext *in_RDX;
  _func_void_intptr_t_char_unsigned_long_unsigned_long_FormatOptions_ptr *in_RSI;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  string_view sVar4;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> in_stack_00000000;
  undefined1 in_stack_00000010 [16];
  undefined1 in_stack_00000030 [16];
  bool in_stack_000000af;
  FormatOptions *in_stack_000000b0;
  ConstantValue *value;
  Type *in_stack_000000c0;
  ConstantValue *in_stack_000000c8;
  string *in_stack_000000d0;
  bool parseOk;
  bool ok;
  string_view fmt;
  StringLiteral *lit;
  Expression *arg;
  iterator argIt;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  EvalContext *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  char in_stack_fffffffffffffe2f;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  char in_stack_fffffffffffffe37;
  undefined1 *in_stack_fffffffffffffe38;
  undefined1 *puVar5;
  Type *in_stack_fffffffffffffe40;
  Expression *in_stack_fffffffffffffea8;
  anon_class_1_0_00000001 local_121;
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)> local_120;
  anon_class_48_6_e639ebdb local_110;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  local_e0;
  anon_class_8_1_6971b95b local_d0;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> local_c8;
  string_view local_b8;
  undefined1 local_9a;
  bool local_99;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  string_view local_88;
  StringLiteral *local_78;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_60;
  Expression *local_58;
  Expression **local_50;
  iterator local_48;
  string local_40;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_20;
  EvalContext *local_18;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar6
  ;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  poVar6 = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe40);
  local_48 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                        in_stack_fffffffffffffe18);
  do {
    while( true ) {
      while( true ) {
        local_50 = (Expression **)
                   std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                             ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                              CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffe20,
                           (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffe18);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          goto LAB_00a2a431;
        }
        local_60 = __gnu_cxx::
                   __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                   ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                                (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        ppEVar2 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                  ::operator*(&local_60);
        local_58 = *ppEVar2;
        if (local_58->kind != EmptyArgument) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                   in_stack_fffffffffffffe2f);
      }
      if (local_58->kind == StringLiteral) break;
      Expression::eval((Expression *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                       in_stack_fffffffffffffe20);
      puVar5 = &stack0xfffffffffffffea8;
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa2a2f0);
      if (bVar1) {
        in_stack_fffffffffffffe40 =
             not_null<const_slang::ast::Type_*>::operator*
                       ((not_null<const_slang::ast::Type_*> *)0xa2a35e);
        in_stack_fffffffffffffe37 =
             getDefaultSpecifier((Expression *)
                                 CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                                 (LiteralBase)((ulong)in_stack_fffffffffffffe20 >> 0x38));
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)0xa2a387);
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)0xa2a394);
        in_stack_fffffffffffffe36 = Expression::isImplicitString(in_stack_fffffffffffffea8);
        SFormat::formatArg(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,value._7_1_,
                           in_stack_000000b0,in_stack_000000af);
      }
      else {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(in_RDI);
        puVar5 = in_stack_fffffffffffffe38;
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa2a400);
      in_stack_fffffffffffffe38 = puVar5;
      if (!bVar1) {
LAB_00a2a431:
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe20);
        return in_RDI;
      }
    }
    local_78 = Expression::as<slang::ast::StringLiteral>(local_58);
    sVar4 = StringLiteral::getRawValue(local_78);
    local_88 = sVar4;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_88);
    sVar4 = local_88;
    if (1 < sVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::length(&local_88);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38,
                         CONCAT17(in_stack_fffffffffffffe37,
                                  CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
      local_98 = sVar4;
    }
    local_99 = true;
    local_d0.result = &local_40;
    local_88 = sVar4;
    local_b8 = sVar4;
    function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::
    function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:343:22)>
              (&local_c8,&local_d0);
    local_110.result = &local_40;
    local_110.argIt = &local_48;
    local_110.args = local_20;
    local_110.context = local_18;
    local_110.ok = &local_99;
    function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
    ::
    function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:344:17)>
              (&local_e0,&local_110);
    function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>::
    function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:360:17)>
              (&local_120,&local_121);
    onArg.callable = (intptr_t)poVar6;
    onArg.callback = in_RSI;
    in_stack_fffffffffffffe18 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120.callback;
    in_stack_fffffffffffffe20 = (EvalContext *)local_120.callable;
    local_9a = SFormat::parse((string_view)in_stack_00000010,in_stack_00000000,onArg,
                              (function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>
                               )in_stack_00000030);
    local_99 = (local_99 & 1U & local_9a) != 0;
  } while (local_99);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(in_RDI);
  goto LAB_00a2a431;
}

Assistant:

std::optional<std::string> FmtHelpers::formatDisplay(
    const Scope& scope, EvalContext& context, const std::span<const Expression* const>& args) {
    std::string result;
    auto argIt = args.begin();
    while (argIt != args.end()) {
        // Empty arguments always print a space.
        auto arg = *argIt++;
        if (arg->kind == ExpressionKind::EmptyArgument) {
            result.push_back(' ');
            continue;
        }

        // Handle string literals as format strings.
        if (arg->kind == ExpressionKind::StringLiteral) {
            // Strip quotes from the raw string.
            auto& lit = arg->as<StringLiteral>();
            std::string_view fmt = lit.getRawValue();
            if (fmt.length() >= 2)
                fmt = fmt.substr(1, fmt.length() - 2);

            bool ok = true;
            bool parseOk = SFormat::parse(
                fmt, [&](std::string_view text) { result += text; },
                [&](char specifier, size_t, size_t, const SFormat::FormatOptions& options) {
                    if (formatSpecialArg(specifier, scope, result))
                        return;

                    if (argIt != args.end()) {
                        auto currentArg = *argIt++;
                        auto&& value = currentArg->eval(context);
                        if (!value) {
                            ok = false;
                            return;
                        }

                        SFormat::formatArg(result, value, *currentArg->type, specifier, options,
                                           currentArg->isImplicitString());
                    }
                },
                [](DiagCode, size_t, size_t, std::optional<char>) {});

            ok &= parseOk;
            if (!ok)
                return std::nullopt;
        }
        else {
            // Otherwise, print the value with default options.
            auto&& value = arg->eval(context);
            if (!value)
                return std::nullopt;

            SFormat::formatArg(result, value, *arg->type,
                               getDefaultSpecifier(*arg, LiteralBase::Decimal), {},
                               arg->isImplicitString());
        }
    }

    return result;
}